

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkSampler_T ** __thiscall
Fossilize::StateRecorder::Impl::copy<VkSampler_T*>
          (Impl *this,VkSampler_T **src,size_t count,ScratchAllocator *alloc)

{
  VkSampler_T **ppVVar1;
  
  if (count != 0) {
    ppVVar1 = ScratchAllocator::allocate_n<VkSampler_T*>(alloc,count);
    if (ppVVar1 != (VkSampler_T **)0x0) {
      ppVVar1 = (VkSampler_T **)memmove(ppVVar1,src,count << 3);
      return ppVVar1;
    }
  }
  return (VkSampler_T **)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}